

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall
QTableWidgetItem::QTableWidgetItem(QTableWidgetItem *this,QIcon *icon,QString *text,int type)

{
  QFlags<Qt::ItemFlag> QVar1;
  QTableWidgetItemPrivate *this_00;
  int in_ECX;
  QString *in_RDX;
  QTableWidgetItem *in_RDI;
  long in_FS_OFFSET;
  ItemFlag in_stack_ffffffffffffff5c;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->_vptr_QTableWidgetItem = (_func_int **)&PTR__QTableWidgetItem_00d304b0;
  in_RDI->rtti = in_ECX;
  QList<QWidgetItemData>::QList((QList<QWidgetItemData> *)0x8d8967);
  in_RDI->view = (QTableWidget *)0x0;
  this_00 = (QTableWidgetItemPrivate *)operator_new(0x10);
  QTableWidgetItemPrivate::QTableWidgetItemPrivate(this_00,in_RDI);
  in_RDI->d = this_00;
  Qt::operator|((enum_type)((ulong)this_00 >> 0x20),(enum_type)this_00);
  QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)this_00,in_stack_ffffffffffffff5c);
  QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)this_00,in_stack_ffffffffffffff5c);
  QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)this_00,in_stack_ffffffffffffff5c);
  QVar1 = QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)this_00,in_stack_ffffffffffffff5c)
  ;
  (in_RDI->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i
       = (Int)QVar1.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i;
  QIcon::operator_cast_to_QVariant((QIcon *)&local_28);
  (*in_RDI->_vptr_QTableWidgetItem[4])(in_RDI,1,&local_28);
  ::QVariant::~QVariant(&local_28);
  ::QVariant::QVariant(&local_48,in_RDX);
  (*in_RDI->_vptr_QTableWidgetItem[4])(in_RDI,0,&local_48);
  ::QVariant::~QVariant(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTableWidgetItem::QTableWidgetItem(const QIcon &icon, const QString &text, int type)
    :  rtti(type), view(nullptr), d(new QTableWidgetItemPrivate(this)),
       itemFlags(Qt::ItemIsEditable
                |Qt::ItemIsSelectable
                |Qt::ItemIsUserCheckable
                |Qt::ItemIsEnabled
                |Qt::ItemIsDragEnabled
                |Qt::ItemIsDropEnabled)
{
    setData(Qt::DecorationRole, icon);
    setData(Qt::DisplayRole, text);
}